

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

bool __thiscall FileWriter::tryWrite(FileWriter *this,string *path)

{
  int iVar1;
  char *__file;
  int *piVar2;
  ulong in_RSI;
  long in_RDI;
  int rv;
  size_type rpos;
  stat st;
  string local_d0 [32];
  long local_b0;
  string *in_stack_ffffffffffffff80;
  
  local_b0 = std::__cxx11::string::rfind((char)in_RSI,0x2f);
  if (local_b0 != -1) {
    std::__cxx11::string::substr((ulong)local_d0,in_RSI);
    util::mkdirp(in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(local_d0);
  }
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)&stack0xffffffffffffff58);
  if ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 2)) {
    return true;
  }
  return (bool)(*(byte *)(in_RDI + 0x20) & 1);
}

Assistant:

bool FileWriter::tryWrite(const std::string& path) {
  struct stat st;

  auto rpos = path.rfind('/');
  if (rpos != std::string::npos) {
    mkdirp(path.substr(0, rpos));
  }

  auto rv = stat(path.c_str(), &st);
  if (rv < 0 && errno == ENOENT) {
    return true;
  }

  return force_;
}